

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTransform.h
# Opt level: O2

ChVector<double> *
chrono::ChTransform<double>::TransformParentToLocal
          (ChVector<double> *parent,ChVector<double> *origin,ChMatrix33<double> *alignment)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  ChVector<double> *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  dVar3 = parent->m_data[1] - origin->m_data[1];
  dVar4 = parent->m_data[0] - origin->m_data[0];
  dVar5 = parent->m_data[2] - origin->m_data[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar4;
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       dVar3 * (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  auVar1 = vfmadd231sd_fma(auVar11,auVar6,auVar1);
  auVar8._0_8_ = dVar3 * (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[3];
  auVar8._8_8_ = dVar3 * (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[4];
  auVar7._8_8_ = dVar4;
  auVar7._0_8_ = dVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar5;
  auVar2 = vfmadd231sd_fma(auVar1,auVar10,auVar2);
  auVar1 = vfmadd132pd_fma(auVar7,auVar8,
                           *(undefined1 (*) [16])
                            (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar9._8_8_ = dVar5;
  auVar9._0_8_ = dVar5;
  auVar1 = vfmadd132pd_fma(auVar9,auVar1,
                           *(undefined1 (*) [16])
                            ((alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 6));
  *(undefined1 (*) [16])in_RDI->m_data = auVar1;
  in_RDI->m_data[2] = auVar2._0_8_;
  return in_RDI;
}

Assistant:

static ChVector<Real> TransformParentToLocal(
        const ChVector<Real>& parent,  ///< point to transform, given in parent coordinates;
        const ChVector<Real>&
            origin,  ///< location of local frame with respect to parent, expressed in parent ref frame;
        const ChMatrix33<Real>&
            alignment  ///< rotation of local frame with respect to parent, expressed in parent coords.
        ) {
        Real mx = parent.x() - origin.x();
        Real my = parent.y() - origin.y();
        Real mz = parent.z() - origin.z();
        return ChVector<Real>(alignment(0, 0) * mx + alignment(1, 0) * my + alignment(2, 0) * mz,
                              alignment(0, 1) * mx + alignment(1, 1) * my + alignment(2, 1) * mz,
                              alignment(0, 2) * mx + alignment(1, 2) * my + alignment(2, 2) * mz);
    }